

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_2::DeepTiledInputFile::readTiles
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  LineOrder LVar1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  pointer ppTVar3;
  TileBuffer *pTVar4;
  InputStreamMutex *pIVar5;
  uint64_t uVar6;
  ulong uVar7;
  pointer ppTVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int n;
  bool bVar12;
  int iVar13;
  int iVar14;
  uint64_t *puVar15;
  uint64_t uVar16;
  undefined4 extraout_var_00;
  char *pcVar17;
  Task *this_00;
  InputExc *pIVar18;
  ostream *poVar19;
  ArgExc *pAVar20;
  IoExc *this_01;
  int iVar21;
  long lVar22;
  int dx;
  string *psVar23;
  ulong uVar24;
  string *psVar25;
  int dy;
  stringstream _iex_throw_s;
  undefined4 uStack_33c;
  ostream local_330 [376];
  TaskGroup taskGroup;
  undefined4 extraout_var;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TInSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar20,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar20,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  bVar12 = isValidLevel(this,lx,ly);
  if (!bVar12) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar19 = std::operator<<(local_330,"Level coordinate (");
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
    poVar19 = std::operator<<(poVar19,", ");
    poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
    std::operator<<(poVar19,") is invalid.");
    pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar20,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  iVar13 = dx2;
  if (dx2 < dx1) {
    iVar13 = dx1;
  }
  if (dx1 < dx2) {
    dx2 = dx1;
  }
  dy = dy2;
  if (dy1 < dy2) {
    dy = dy1;
  }
  if (dy2 < dy1) {
    dy2 = dy1;
  }
  LVar1 = pDVar2->lineOrder;
  iVar21 = dy + -1;
  if (LVar1 != DECREASING_Y) {
    iVar21 = dy2 + 1;
  }
  IlmThread_3_2::TaskGroup::TaskGroup(&taskGroup);
  if (LVar1 == DECREASING_Y) {
    dy = dy2;
  }
  uVar24 = 0;
  do {
    if (dy == iVar21) {
      IlmThread_3_2::TaskGroup::~TaskGroup(&taskGroup);
      ppTVar3 = (this->_data->tileBuffers).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar8 = (this->_data->tileBuffers).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      psVar23 = (string *)0x0;
      for (lVar22 = 0; (long)ppTVar8 - (long)ppTVar3 >> 3 != lVar22; lVar22 = lVar22 + 1) {
        pTVar4 = ppTVar3[lVar22];
        psVar25 = (string *)&pTVar4->exception;
        if (psVar23 != (string *)0x0) {
          psVar25 = psVar23;
        }
        if (pTVar4->hasException != false) {
          psVar23 = psVar25;
        }
        pTVar4->hasException = false;
      }
      if (psVar23 == (string *)0x0) {
        pthread_mutex_unlock(__mutex);
        return;
      }
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::IoExc::IoExc(this_01,psVar23);
      __cxa_throw(this_01,&Iex_3_2::IoExc::typeinfo,Iex_3_2::IoExc::~IoExc);
    }
    uVar24 = (ulong)(int)uVar24;
    for (dx = dx2; dx <= iVar13; dx = dx + 1) {
      bVar12 = isValidTile(this,dx,dy,lx,ly);
      if (!bVar12) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"Tile (");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,dx);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,dy);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
        poVar19 = std::operator<<(poVar19,",");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
        std::operator<<(poVar19,") is not a valid tile.");
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar20,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      pDVar2 = this->_data;
      ppTVar3 = (pDVar2->tileBuffers).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pTVar4 = ppTVar3[uVar24 % (ulong)((long)(pDVar2->tileBuffers).
                                              super__Vector_base<Imf_3_2::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TileBuffer_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppTVar3 >> 3)];
      IlmThread_3_2::Semaphore::wait();
      pTVar4->dx = dx;
      pTVar4->dy = dy;
      pTVar4->lx = lx;
      pTVar4->ly = ly;
      pTVar4->uncompressedData = (char *)0x0;
      pIVar5 = pDVar2->_streamData;
      puVar15 = TileOffsets::operator()(&pDVar2->tileOffsets,dx,dy,lx,ly);
      uVar6 = *puVar15;
      if (uVar6 == 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"Tile (");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,dx);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,dy);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,lx);
        poVar19 = std::operator<<(poVar19,", ");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,ly);
        std::operator<<(poVar19,") is missing.");
        pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(pIVar18,(stringstream *)&_iex_throw_s);
        __cxa_throw(pIVar18,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
      }
      if ((pDVar2->version & 0x1000) == 0) {
        uVar16 = pIVar5->currentPosition;
      }
      else {
        iVar14 = (*pIVar5->is->_vptr_IStream[5])();
        uVar16 = CONCAT44(extraout_var,iVar14);
      }
      if (uVar16 != uVar6) {
        (*pIVar5->is->_vptr_IStream[6])(pIVar5->is,uVar6);
      }
      if (((pDVar2->version & 0x1000) != 0) &&
         ((*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4),
         __iex_throw_s != pDVar2->partNumber)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"Unexpected part number ");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,__iex_throw_s);
        poVar19 = std::operator<<(poVar19,", should be ");
        poVar19 = (ostream *)std::ostream::operator<<((ostream *)poVar19,pDVar2->partNumber);
        std::operator<<(poVar19,".");
        pAVar20 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar20,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar20,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4);
      iVar14 = __iex_throw_s;
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4);
      iVar9 = __iex_throw_s;
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4);
      iVar10 = __iex_throw_s;
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,4);
      iVar11 = __iex_throw_s;
      (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,&_iex_throw_s,8);
      n = __iex_throw_s;
      puVar15 = &pTVar4->dataSize;
      lVar22 = CONCAT44(uStack_33c,__iex_throw_s);
      Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(pIVar5->is,puVar15);
      Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(pIVar5->is,&pTVar4->uncompressedDataSize);
      Xdr::skip<Imf_3_2::StreamIO,Imf_3_2::IStream>(pIVar5->is,n);
      if (dx != iVar14) {
        pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(pIVar18,"Unexpected tile x coordinate.");
LAB_0016b4ec:
        __cxa_throw(pIVar18,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
      }
      if (iVar9 != dy) {
        pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(pIVar18,"Unexpected tile y coordinate.");
        goto LAB_0016b4ec;
      }
      if (iVar10 != lx) {
        pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(pIVar18,"Unexpected tile x level number coordinate.");
        goto LAB_0016b4ec;
      }
      if (iVar11 != ly) {
        pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::InputExc::InputExc(pIVar18,"Unexpected tile y level number coordinate.");
        goto LAB_0016b4ec;
      }
      iVar14 = (*pIVar5->is->_vptr_IStream[2])();
      if ((char)iVar14 == '\0') {
        if (pTVar4->buffer != (char *)0x0) {
          operator_delete__(pTVar4->buffer);
        }
        uVar7 = *puVar15;
        pcVar17 = (char *)operator_new__(uVar7);
        pTVar4->buffer = pcVar17;
        (*pIVar5->is->_vptr_IStream[3])(pIVar5->is,pcVar17,uVar7 & 0xffffffff);
      }
      else {
        iVar14 = (*pIVar5->is->_vptr_IStream[4])(pIVar5->is,(ulong)(uint)*puVar15);
        pTVar4->buffer = (char *)CONCAT44(extraout_var_00,iVar14);
      }
      pIVar5->currentPosition = *puVar15 + uVar6 + lVar22 + 0x28;
      this_00 = (Task *)operator_new(0x20);
      IlmThread_3_2::Task::Task(this_00,&taskGroup);
      *(undefined ***)this_00 = &PTR__TileBufferTask_003d34f0;
      *(Data **)(this_00 + 0x10) = pDVar2;
      *(TileBuffer **)(this_00 + 0x18) = pTVar4;
      IlmThread_3_2::ThreadPool::addGlobalTask(this_00);
      uVar24 = uVar24 + 1;
    }
    dy = dy + (uint)(LVar1 != DECREASING_Y) * 2 + -1;
  } while( true );
}

Assistant:

void
DeepTiledInputFile::readTiles (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data destination.");

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");

        //
        // Determine the first and last tile coordinates in both dimensions.
        // We always attempt to read the range of tiles in the order that
        // they are stored in the file.
        //

        if (dx1 > dx2) std::swap (dx1, dx2);

        if (dy1 > dy2) std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;
            int       tileNumber = 0;

            for (int dy = dyStart; dy != dyStop; dy += dY)
            {
                for (int dx = dx1; dx <= dx2; dx++)
                {
                    if (!isValidTile (dx, dy, lx, ly))
                        THROW (
                            IEX_NAMESPACE::ArgExc,
                            "Tile (" << dx << ", " << dy << ", " << lx << ","
                                     << ly << ") is not a valid tile.");

                    ThreadPool::addGlobalTask (newTileBufferTask (
                        &taskGroup, _data, tileNumber++, dx, dy, lx, ly));
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledInputFile::readTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size (); ++i)
        {
            TileBuffer* tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading pixel data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}